

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::setSmooth(Texture *this,bool smooth)

{
  byte in_SIL;
  long in_RDI;
  TextureSaver save;
  TransientContextLock lock;
  char *in_stack_00000120;
  uint in_stack_0000012c;
  char *in_stack_00000130;
  TransientContextLock *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  
  if (((in_SIL & 1) != (*(byte *)(in_RDI + 0x14) & 1)) &&
     (*(byte *)(in_RDI + 0x14) = in_SIL & 1, *(int *)(in_RDI + 0x10) != 0)) {
    GlResource::TransientContextLock::TransientContextLock
              ((TransientContextLock *)
               (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
    priv::TextureSaver::TextureSaver((TextureSaver *)in_stack_ffffffffffffffe0);
    glBindTexture(0xde1,*(undefined4 *)(in_RDI + 0x10));
    priv::glCheckError(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
    glTexParameteri(0xde1,0x2800,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
    priv::glCheckError(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
    if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
      glTexParameteri(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
      priv::glCheckError(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
    }
    else {
      glTexParameteri(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2702);
      priv::glCheckError(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
    }
    priv::TextureSaver::~TextureSaver((TextureSaver *)in_stack_ffffffffffffffe0);
    GlResource::TransientContextLock::~TransientContextLock(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void Texture::setSmooth(bool smooth)
{
    if (smooth != m_isSmooth)
    {
        m_isSmooth = smooth;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));

            if (m_hasMipmap)
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR_MIPMAP_LINEAR : GL_NEAREST_MIPMAP_LINEAR));
            }
            else
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            }
        }
    }
}